

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddPositionIndependentFlags
          (cmLocalGenerator *this,string *flags,string *lang,int targetType)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  string *o;
  pointer pbVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view arg;
  string picFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string local_98;
  char *local_78;
  size_t local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  local_70 = 0;
  local_68 = '\0';
  local_78 = &local_68;
  if (targetType == 0) {
    pcVar1 = this->Makefile;
    local_40 = (lang->_M_dataplus)._M_p;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)lang->_M_string_length;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6baae2;
    local_38 = 0x14;
    local_30 = "_COMPILE_OPTIONS_PIE";
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_58;
    cmCatViews_abi_cxx11_(&local_98,views_00);
    cmMakefile::GetSafeDefinition(pcVar1,&local_98);
    std::__cxx11::string::_M_assign((string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_70 == 0) goto LAB_003c6f76;
  }
  else {
LAB_003c6f76:
    pcVar1 = this->Makefile;
    local_40 = (lang->_M_dataplus)._M_p;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)lang->_M_string_length;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6baae2;
    local_38 = 0x14;
    local_30 = "_COMPILE_OPTIONS_PIC";
    views._M_len = 3;
    views._M_array = (iterator)&local_58;
    cmCatViews_abi_cxx11_(&local_98,views);
    cmMakefile::GetSafeDefinition(pcVar1,&local_98);
    std::__cxx11::string::_M_assign((string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_70 == 0) goto LAB_003c70d0;
  }
  arg._M_str = local_78;
  arg._M_len = local_70;
  cmExpandedList_abi_cxx11_(&local_58,arg,false);
  pbVar2 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
LAB_003c70d0:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddPositionIndependentFlags(std::string& flags,
                                                   std::string const& lang,
                                                   int targetType)
{
  std::string picFlags;

  if (targetType == cmStateEnums::EXECUTABLE) {
    picFlags = this->Makefile->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_PIE"));
  }
  if (picFlags.empty()) {
    picFlags = this->Makefile->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_PIC"));
  }
  if (!picFlags.empty()) {
    std::vector<std::string> options = cmExpandedList(picFlags);
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}